

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall CEngine::CEngine(CEngine *this,char *pAppname)

{
  int64 iVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  IEngine *in_stack_ffffffffffffffe0;
  
  IEngine::IEngine(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__CEngine_00185670;
  iVar1 = time_get();
  srand((uint)iVar1);
  dbg_logger_stdout();
  dbg_logger_debugger();
  dbg_msg("engine","running on %s-%s-%s","unix","linux","amd64");
  dbg_msg("engine","arch is little endian");
  CJobPool::Init((CJobPool *)in_stack_ffffffffffffffe0,(int)((ulong)iVar1 >> 0x20));
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2d] = in_RSI;
  return;
}

Assistant:

CEngine(const char *pAppname)
	{
		srand(time_get());
		dbg_logger_stdout();
		dbg_logger_debugger();

		//
		dbg_msg("engine", "running on %s-%s-%s", CONF_FAMILY_STRING, CONF_PLATFORM_STRING, CONF_ARCH_STRING);
	#ifdef CONF_ARCH_ENDIAN_LITTLE
		dbg_msg("engine", "arch is little endian");
	#elif defined(CONF_ARCH_ENDIAN_BIG)
		dbg_msg("engine", "arch is big endian");
	#else
		dbg_msg("engine", "unknown endian");
	#endif

		m_JobPool.Init(1);

		m_DataLogSent = 0;
		m_DataLogRecv = 0;
		m_Logging = false;
		m_pAppname = pAppname;
	}